

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O2

void __thiscall
soplex::
SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scale(SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lp,bool persistent)

{
  Real val;
  type_conflict5 tVar1;
  SPxOut *pSVar2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *epsilon_00;
  DataArray<int> *scaleExp;
  char *t;
  DataArray<int> *coScaleExp;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vecset;
  Verbosity old_verbosity_1;
  undefined4 uStack_634;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_630;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowratio;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  colratio;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_498;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_350;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_300;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_260;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_210;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_170;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_120;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_80;
  
  pSVar2 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if ((pSVar2 != (SPxOut *)0x0) && (2 < (int)pSVar2->m_verbosity)) {
    rowratio.m_backend.data._M_elems[0] = 3;
    colratio.m_backend.data._M_elems[0] = pSVar2->m_verbosity;
    (*pSVar2->_vptr_SPxOut[2])();
    pSVar2 = soplex::operator<<((this->
                                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).spxout,"Equilibrium scaling LP");
    t = "";
    if (persistent) {
      t = " (persistent)";
    }
    pSVar2 = soplex::operator<<(pSVar2,t);
    std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
    pSVar2 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar2->_vptr_SPxOut[2])(pSVar2,&colratio);
  }
  (**(this->
     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     )._vptr_SPxScaler)(this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x33])(&colratio,this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x34])(&rowratio,this,lp);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&old_verbosity_1,
             &(this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  val = Tolerances::epsilon((Tolerances *)CONCAT44(uStack_634,old_verbosity_1));
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&epsilon.m_backend,val,(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_630);
  tVar1 = boost::multiprecision::operator<(&colratio,&rowratio);
  pSVar2 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if ((pSVar2 != (SPxOut *)0x0) && (3 < (int)pSVar2->m_verbosity)) {
    old_verbosity_1 = pSVar2->m_verbosity;
    (*pSVar2->_vptr_SPxOut[2])();
    pSVar2 = soplex::operator<<((this->
                                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).spxout,"before scaling:");
    pSVar2 = soplex::operator<<(pSVar2," min= ");
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(&local_80,lp,1);
    pSVar2 = soplex::operator<<(pSVar2,&local_80);
    pSVar2 = soplex::operator<<(pSVar2," max= ");
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(&local_d0,lp,1);
    pSVar2 = soplex::operator<<(pSVar2,&local_d0);
    pSVar2 = soplex::operator<<(pSVar2," col-ratio= ");
    local_3a8.m_backend.data._M_elems[1] = colratio.m_backend.data._M_elems[1];
    local_3a8.m_backend.data._M_elems[0] = colratio.m_backend.data._M_elems[0];
    local_3a8.m_backend.data._M_elems[2] = colratio.m_backend.data._M_elems[2];
    local_3a8.m_backend.data._M_elems[3] = colratio.m_backend.data._M_elems[3];
    local_3a8.m_backend.data._M_elems[4] = colratio.m_backend.data._M_elems[4];
    local_3a8.m_backend.data._M_elems[5] = colratio.m_backend.data._M_elems[5];
    local_3a8.m_backend.data._M_elems[6] = colratio.m_backend.data._M_elems[6];
    local_3a8.m_backend.data._M_elems[7] = colratio.m_backend.data._M_elems[7];
    local_3a8.m_backend.data._M_elems[8] = colratio.m_backend.data._M_elems[8];
    local_3a8.m_backend.data._M_elems[9] = colratio.m_backend.data._M_elems[9];
    local_3a8.m_backend.data._M_elems[10] = colratio.m_backend.data._M_elems[10];
    local_3a8.m_backend.data._M_elems[0xb] = colratio.m_backend.data._M_elems[0xb];
    local_3a8.m_backend.data._M_elems[0xc] = colratio.m_backend.data._M_elems[0xc];
    local_3a8.m_backend.data._M_elems[0xd] = colratio.m_backend.data._M_elems[0xd];
    local_3a8.m_backend.data._M_elems[0xe] = colratio.m_backend.data._M_elems[0xe];
    local_3a8.m_backend.data._M_elems[0xf] = colratio.m_backend.data._M_elems[0xf];
    local_3a8.m_backend.exp = colratio.m_backend.exp;
    local_3a8.m_backend.neg = colratio.m_backend.neg;
    local_3a8.m_backend.fpclass = colratio.m_backend.fpclass;
    local_3a8.m_backend.prec_elem = colratio.m_backend.prec_elem;
    pSVar2 = soplex::operator<<(pSVar2,&local_3a8);
    pSVar2 = soplex::operator<<(pSVar2," row-ratio= ");
    local_3f8.m_backend.data._M_elems[1] = rowratio.m_backend.data._M_elems[1];
    local_3f8.m_backend.data._M_elems[0] = rowratio.m_backend.data._M_elems[0];
    local_3f8.m_backend.data._M_elems[2] = rowratio.m_backend.data._M_elems[2];
    local_3f8.m_backend.data._M_elems[3] = rowratio.m_backend.data._M_elems[3];
    local_3f8.m_backend.data._M_elems[4] = rowratio.m_backend.data._M_elems[4];
    local_3f8.m_backend.data._M_elems[5] = rowratio.m_backend.data._M_elems[5];
    local_3f8.m_backend.data._M_elems[6] = rowratio.m_backend.data._M_elems[6];
    local_3f8.m_backend.data._M_elems[7] = rowratio.m_backend.data._M_elems[7];
    local_3f8.m_backend.data._M_elems[8] = rowratio.m_backend.data._M_elems[8];
    local_3f8.m_backend.data._M_elems[9] = rowratio.m_backend.data._M_elems[9];
    local_3f8.m_backend.data._M_elems[10] = rowratio.m_backend.data._M_elems[10];
    local_3f8.m_backend.data._M_elems[0xb] = rowratio.m_backend.data._M_elems[0xb];
    local_3f8.m_backend.data._M_elems[0xc] = rowratio.m_backend.data._M_elems[0xc];
    local_3f8.m_backend.data._M_elems[0xd] = rowratio.m_backend.data._M_elems[0xd];
    local_3f8.m_backend.data._M_elems[0xe] = rowratio.m_backend.data._M_elems[0xe];
    local_3f8.m_backend.data._M_elems[0xf] = rowratio.m_backend.data._M_elems[0xf];
    local_3f8.m_backend.exp = rowratio.m_backend.exp;
    local_3f8.m_backend.neg = rowratio.m_backend.neg;
    local_3f8.m_backend.fpclass = rowratio.m_backend.fpclass;
    local_3f8.m_backend.prec_elem = rowratio.m_backend.prec_elem;
    pSVar2 = soplex::operator<<(pSVar2,&local_3f8);
    std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
    pSVar2 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar2->_vptr_SPxOut[2])(pSVar2,&old_verbosity_1);
  }
  if (tVar1) {
    local_448.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
    local_448.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
    local_448.m_backend.data._M_elems[0xe] = epsilon.m_backend.data._M_elems[0xe];
    local_448.m_backend.data._M_elems[0xf] = epsilon.m_backend.data._M_elems[0xf];
    local_448.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
    local_448.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
    local_448.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
    local_448.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
    local_448.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_448.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_448.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    local_448.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
    local_448.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_448.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_448.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_448.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_448.m_backend.exp = epsilon.m_backend.exp;
    local_448.m_backend.neg = epsilon.m_backend.neg;
    local_448.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_448.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    computeEquiExpVec(&(lp->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ,(this->
                       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).m_activeRowscaleExp,
                      (this->
                      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_activeColscaleExp,&local_448);
    if ((this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_doBoth != true) goto LAB_003528cd;
    coScaleExp = (this->
                 super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_activeColscaleExp;
    scaleExp = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_activeRowscaleExp;
    epsilon_00 = &local_498;
    local_498.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
    local_498.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
    local_498.m_backend.data._M_elems[0xe] = epsilon.m_backend.data._M_elems[0xe];
    local_498.m_backend.data._M_elems[0xf] = epsilon.m_backend.data._M_elems[0xf];
    local_498.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
    local_498.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
    local_498.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
    local_498.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
    local_498.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_498.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_498.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    local_498.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
    local_498.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_498.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_498.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_498.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_498.m_backend.exp = epsilon.m_backend.exp;
    local_498.m_backend.neg = epsilon.m_backend.neg;
    local_498.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_498.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    vecset = lp;
  }
  else {
    local_4e8.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
    local_4e8.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
    local_4e8.m_backend.data._M_elems[0xe] = epsilon.m_backend.data._M_elems[0xe];
    local_4e8.m_backend.data._M_elems[0xf] = epsilon.m_backend.data._M_elems[0xf];
    local_4e8.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
    local_4e8.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
    local_4e8.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
    local_4e8.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
    local_4e8.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_4e8.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_4e8.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    local_4e8.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
    local_4e8.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_4e8.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_4e8.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_4e8.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_4e8.m_backend.exp = epsilon.m_backend.exp;
    local_4e8.m_backend.neg = epsilon.m_backend.neg;
    local_4e8.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_4e8.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    computeEquiExpVec((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)lp,(this->
                            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).m_activeColscaleExp,
                      (this->
                      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_activeRowscaleExp,&local_4e8);
    if ((this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_doBoth != true) goto LAB_003528cd;
    vecset = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    scaleExp = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_activeColscaleExp;
    coScaleExp = (this->
                 super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_activeRowscaleExp;
    epsilon_00 = &local_538;
    local_538.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
    local_538.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
    local_538.m_backend.data._M_elems[0xe] = epsilon.m_backend.data._M_elems[0xe];
    local_538.m_backend.data._M_elems[0xf] = epsilon.m_backend.data._M_elems[0xf];
    local_538.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
    local_538.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
    local_538.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
    local_538.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
    local_538.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_538.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_538.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    local_538.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
    local_538.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_538.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_538.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_538.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_538.m_backend.exp = epsilon.m_backend.exp;
    local_538.m_backend.neg = epsilon.m_backend.neg;
    local_538.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_538.m_backend.prec_elem = epsilon.m_backend.prec_elem;
  }
  computeEquiExpVec((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)vecset,coScaleExp,scaleExp,epsilon_00);
LAB_003528cd:
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[2])(this,lp);
  pSVar2 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if (pSVar2 != (SPxOut *)0x0) {
    old_verbosity_1 = pSVar2->m_verbosity;
    if (4 < (int)old_verbosity_1) {
      (*pSVar2->_vptr_SPxOut[2])();
      pSVar2 = soplex::operator<<((this->
                                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout,"Row scaling min= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x31])(&local_120,this);
      pSVar2 = soplex::operator<<(pSVar2,&local_120);
      pSVar2 = soplex::operator<<(pSVar2," max= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x32])(&local_170,this);
      pSVar2 = soplex::operator<<(pSVar2,&local_170);
      std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
      pSVar2 = soplex::operator<<(pSVar2,"Col scaling min= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x2f])(&local_1c0,this);
      pSVar2 = soplex::operator<<(pSVar2,&local_1c0);
      pSVar2 = soplex::operator<<(pSVar2," max= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x30])(&local_210,this);
      pSVar2 = soplex::operator<<(pSVar2,&local_210);
      std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
      pSVar2 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar2->_vptr_SPxOut[2])(pSVar2,&old_verbosity_1);
      pSVar2 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      if (pSVar2 == (SPxOut *)0x0) {
        return;
      }
    }
    old_verbosity_1 = pSVar2->m_verbosity;
    if (3 < (int)old_verbosity_1) {
      (*pSVar2->_vptr_SPxOut[2])();
      pSVar2 = soplex::operator<<((this->
                                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout,"after scaling: ");
      pSVar2 = soplex::operator<<(pSVar2," min= ");
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[3])(&local_260,lp,0);
      pSVar2 = soplex::operator<<(pSVar2,&local_260);
      pSVar2 = soplex::operator<<(pSVar2," max= ");
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[4])(&local_2b0,lp,0);
      pSVar2 = soplex::operator<<(pSVar2,&local_2b0);
      pSVar2 = soplex::operator<<(pSVar2," col-ratio= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x33])(&local_300,this,lp);
      pSVar2 = soplex::operator<<(pSVar2,&local_300);
      pSVar2 = soplex::operator<<(pSVar2," row-ratio= ");
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x34])(&local_350,this,lp);
      pSVar2 = soplex::operator<<(pSVar2,&local_350);
      std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
      pSVar2 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar2->_vptr_SPxOut[2])(pSVar2,&old_verbosity_1);
    }
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Equilibrium scaling LP" <<
                 (persistent ? " (persistent)" : "") << std::endl;)

   this->setup(lp);

   /* We want to do the direction first, which has a lower maximal ratio,
    * since the lowest value in the scaled matrix is bounded from below by
    * the inverse of the maximum ratio of the direction that is done first
    * Example:
    *
    *                     Rowratio
    *            0.1  1   10
    *            10   1   10
    *
    * Colratio   100  1
    *
    * Row first =>         Col next =>
    *            0.1  1          0.1  1
    *            1    0.1        1    0.1
    *
    * Col first =>         Row next =>
    *            0.01 1          0.01 1
    *            1    1          1    1
    *
    */
   R colratio = this->maxColRatio(lp);
   R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   bool colFirst = colratio < rowratio;

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   if(colFirst)
   {
      computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);
   }
   else
   {
      computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);
   }

   /* scale */
   this->applyScaling(lp);

   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                 << " max= " << this->maxAbsRowscale()
                 << std::endl
                 << "Col scaling min= " << this->minAbsColscale()
                 << " max= " << this->maxAbsColscale()
                 << std::endl;)

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                 << " min= " << lp.minAbsNzo(false)
                 << " max= " << lp.maxAbsNzo(false)
                 << " col-ratio= " << this->maxColRatio(lp)
                 << " row-ratio= " << this->maxRowRatio(lp)
                 << std::endl;)

}